

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Gl_Device_Plugin.cxx
# Opt level: O0

int __thiscall
Fl_Gl_Device_Plugin::print(Fl_Gl_Device_Plugin *this,Fl_Widget *w,int x,int y,int height)

{
  uchar *puVar1;
  int iVar2;
  int iVar3;
  int H;
  undefined4 extraout_var;
  Fl_RGB_Image *this_00;
  int local_54;
  int ld;
  Fl_RGB_Image *img;
  Fl_Gl_Window *glw;
  int height_local;
  int y_local;
  int x_local;
  Fl_Widget *w_local;
  Fl_Gl_Device_Plugin *this_local;
  Fl_Gl_Window *glw_00;
  
  iVar2 = (*w->_vptr_Fl_Widget[9])();
  glw_00 = (Fl_Gl_Window *)CONCAT44(extraout_var,iVar2);
  if (glw_00 == (Fl_Gl_Window *)0x0) {
    this_local._4_4_ = 0;
  }
  else {
    iVar2 = Fl_Widget::w((Fl_Widget *)glw_00);
    iVar3 = Fl_Widget::h((Fl_Widget *)glw_00);
    this_00 = capture_gl_rectangle(glw_00,0,0,iVar2,iVar3);
    iVar2 = Fl_Image::ld(&this_00->super_Fl_Image);
    if (iVar2 == 0) {
      local_54 = Fl_Image::w(&this_00->super_Fl_Image);
      iVar2 = Fl_Image::d(&this_00->super_Fl_Image);
      local_54 = local_54 * iVar2;
    }
    else {
      local_54 = Fl_Image::ld(&this_00->super_Fl_Image);
    }
    puVar1 = this_00->array;
    iVar2 = Fl_Image::h(&this_00->super_Fl_Image);
    iVar3 = Fl_Image::w(&this_00->super_Fl_Image);
    H = Fl_Image::h(&this_00->super_Fl_Image);
    fl_draw_image(puVar1 + (iVar2 + -1) * local_54,x,y,iVar3,H,3,-local_54);
    if (this_00 != (Fl_RGB_Image *)0x0) {
      (*(this_00->super_Fl_Image)._vptr_Fl_Image[1])();
    }
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

virtual int print(Fl_Widget *w, int x, int y, int height /*useless*/) {
    Fl_Gl_Window *glw = w->as_gl_window();
    if (!glw) return 0;
    Fl_RGB_Image *img = capture_gl_rectangle(glw, 0, 0, glw->w(), glw->h());
#ifdef __APPLE__
    if (Fl_Surface_Device::surface()->class_name() == Fl_Printer::class_id) {
      // convert the image to CGImage, and draw it at full res (useful on retina display)
      CGColorSpaceRef cSpace = CGColorSpaceCreateDeviceRGB();
      CGDataProviderRef provider = CGDataProviderCreateWithData(img, img->array, img->ld() * img->h(), imgProviderReleaseData);
      CGImageRef cgimg = CGImageCreate(img->w(), img->h(), 8, 24, img->ld(), cSpace,
                                     (CGBitmapInfo)(kCGImageAlphaNone),
                                     provider, NULL, false, kCGRenderingIntentDefault);
      CGColorSpaceRelease(cSpace);
      CGDataProviderRelease(provider);
      CGContextDrawImage(fl_gc, CGRectMake(0, 0, glw->w(), glw->h()), cgimg);
      CFRelease(cgimg);
      return 1;
    } else if (img->w() > glw->w()) {
      Fl_RGB_Image *img2 = (Fl_RGB_Image*)img->copy(glw->w(), glw->h());
      delete img;
      img = img2;
    }
#endif
    int ld = img->ld() ? img->ld() : img->w() * img->d();
    fl_draw_image(img->array + (img->h() - 1) * ld, x, y , img->w(), img->h(), 3, - ld);
    delete img;
    return 1;
  }